

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SequenceWithMatchExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SequenceWithMatchExpr,slang::ast::AssertionExpr_const&,std::optional<slang::ast::SequenceRepetition>&,nonstd::span_lite::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
          (BumpAllocator *this,AssertionExpr *args,optional<slang::ast::SequenceRepetition> *args_1,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args_2)

{
  SequenceWithMatchExpr *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args_local_2;
  optional<slang::ast::SequenceRepetition> *args_local_1;
  AssertionExpr *args_local;
  BumpAllocator *this_local;
  
  this_00 = (SequenceWithMatchExpr *)allocate(this,0x40,8);
  ast::SequenceWithMatchExpr::SequenceWithMatchExpr
            (this_00,args,
             (optional<slang::ast::SequenceRepetition>)
             (args_1->super__Optional_base<slang::ast::SequenceRepetition,_true,_true>)._M_payload.
             super__Optional_payload_base<slang::ast::SequenceRepetition>,*args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }